

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::LessThanTest<unsigned_long_long,unsigned_short>(void)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_00;
  bool bVar1;
  uint in_stack_ffffffffffffffc8;
  uint uVar2;
  uint uVar3;
  undefined2 in_stack_ffffffffffffffcc;
  unsigned_short in_stack_ffffffffffffffce;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int *)CONCAT26(in_stack_ffffffffffffffce,
                             CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
  rhs.m_int._4_4_ = in_stack_ffffffffffffffd4;
  rhs.m_int._0_4_ = in_stack_ffffffffffffffd0;
  bVar1 = ::operator<(in_stack_ffffffffffffffce,rhs);
  uVar2 = in_stack_ffffffffffffffc8 & 0xffffff;
  uVar3 = uVar2;
  if (bVar1) {
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (int *)(CONCAT26(in_stack_ffffffffffffffce,
                                CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)) &
                      0xffffffff00ffffff));
    lhs.m_int._4_4_ = in_stack_ffffffffffffffd4;
    lhs.m_int._0_4_ = in_stack_ffffffffffffffd0;
    bVar1 = ::operator<(lhs,in_stack_ffffffffffffffce);
    uVar3 = uVar2 & 0xffffff;
    if (bVar1) {
      uVar4 = 6;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                    *)CONCAT44(6,in_stack_ffffffffffffffd0),
                   (int *)(CONCAT26(in_stack_ffffffffffffffce,
                                    CONCAT24(in_stack_ffffffffffffffcc,uVar2)) & 0xffffffff00ffffff)
                  );
      rhs_00.m_int = 0;
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(uVar4,in_stack_ffffffffffffffd0),(int *)(ulong)CONCAT24(7,uVar3));
      lhs_00.m_int._4_4_ = uVar4;
      lhs_00.m_int._0_4_ = in_stack_ffffffffffffffd0;
      bVar1 = ::operator<(lhs_00,rhs_00);
      uVar3 = (uint)bVar1 << 0x18;
    }
  }
  return SUB41(uVar3 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanTest()
	{
		return
			(U)2 < SafeInt<T>(3) &&
			SafeInt<T>(4) < (U)5 &&
			SafeInt<T>(6) < SafeInt<U>(7);
	}